

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void check_joyp_intr(Emulator *e)

{
  u8 *puVar1;
  JoypadCallback p_Var2;
  byte bVar3;
  
  p_Var2 = (e->joypad_info).callback;
  if ((p_Var2 != (JoypadCallback)0x0) && (9999 < (e->state).ticks - (e->state).joyp.last_callback))
  {
    (*p_Var2)(&(e->state).joyp.buttons,(e->joypad_info).user_data);
    (e->state).joyp.last_callback = (e->state).ticks;
  }
  bVar3 = read_joyp_p10_p13(e);
  if ((byte)(((e->state).joyp.last_p10_p13 ^ bVar3) & ~bVar3) != 0) {
    puVar1 = &(e->state).interrupt.new_if;
    *puVar1 = *puVar1 | 0x10;
  }
  (e->state).joyp.last_p10_p13 = bVar3;
  return;
}

Assistant:

static void check_joyp_intr(Emulator* e) {
  call_joyp_callback(e, TRUE);
  u8 p10_p13 = read_joyp_p10_p13(e);
  /* joyp interrupt only triggers on p10-p13 going from high to low (i.e. not
   * pressed to pressed). */
  if ((p10_p13 ^ JOYP.last_p10_p13) & ~p10_p13) {
    INTR.new_if |= IF_JOYPAD;
  }
  JOYP.last_p10_p13 = p10_p13;
}